

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QOcspResponsePrivate>::detach_helper
          (QSharedDataPointer<QOcspResponsePrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QOcspResponsePrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QOcspResponsePrivate> *in_RDI;
  void *in_R8;
  QOcspResponsePrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x15c71b);
  Qt::totally_ordered_wrapper<QOcspResponsePrivate_*>::get
            ((totally_ordered_wrapper<QOcspResponsePrivate_*> *)in_RDI);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x15c72d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QOcspResponsePrivate_*>::get
                          ((totally_ordered_wrapper<QOcspResponsePrivate_*> *)in_RDI),
     this_00 != (QOcspResponsePrivate *)0x0)) {
    QOcspResponsePrivate::~QOcspResponsePrivate(this_00);
    operator_delete(this_00,0x20);
  }
  Qt::totally_ordered_wrapper<QOcspResponsePrivate_*>::reset
            ((totally_ordered_wrapper<QOcspResponsePrivate_*> *)in_RDI,
             (QOcspResponsePrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}